

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3_int64 localtimeOffset(DateTime *p,sqlite3_context *pCtx,int *pRc)

{
  double dVar1;
  sqlite3_int64 sVar2;
  sqlite3_mutex *psVar3;
  tm *ptVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  time_t t;
  DateTime x;
  DateTime y;
  long local_a0;
  DateTime local_98;
  DateTime local_60;
  
  local_98.iJD = p->iJD;
  local_98.Y = p->Y;
  local_98.M = p->M;
  local_98.D = p->D;
  local_98.h = p->h;
  local_98.m = p->m;
  local_98.tz = p->tz;
  local_98.s = p->s;
  local_98.validYMD = p->validYMD;
  local_98.validHMS = p->validHMS;
  local_98.validJD = p->validJD;
  local_98.validTZ = p->validTZ;
  local_98._44_4_ = *(undefined4 *)&p->field_0x2c;
  computeYMD(&local_98);
  computeHMS(&local_98);
  if (local_98.Y - 0x7f6U < 0xffffffbd) {
    local_98.Y = 2000;
    local_98.M = 1;
    local_98.D = 1;
    local_98.h = 0;
    local_98.m = 0;
    local_98.tz = 0;
    local_98.s = 0.0;
  }
  else {
    local_98.s = (double)(int)(local_98.s + 0.5);
  }
  local_98._24_8_ = local_98._24_8_ & 0xffffffff;
  local_98.validJD = '\0';
  computeJD(&local_98);
  sVar2 = local_98.iJD;
  local_a0 = local_98.iJD / 1000 + -0x3118a36940;
  if (sqlite3Config.bCoreMutex == 0) {
    psVar3 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(2);
  }
  if (psVar3 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar3);
  }
  ptVar4 = localtime(&local_a0);
  bVar10 = sqlite3Config.bLocaltimeFault != 0;
  if (ptVar4 == (tm *)0x0 || bVar10) {
    iVar8 = 0x76c;
    iVar7 = 1;
    iVar5 = 0;
    dVar1 = 0.0;
    iVar6 = 0;
    iVar9 = 0;
  }
  else {
    iVar5 = ptVar4->tm_min;
    iVar6 = ptVar4->tm_hour;
    iVar9 = ptVar4->tm_mday;
    iVar8 = ptVar4->tm_year + 0x76c;
    iVar7 = ptVar4->tm_mon + 1;
    dVar1 = (double)ptVar4->tm_sec;
  }
  if (psVar3 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar3);
  }
  if (ptVar4 == (tm *)0x0 || bVar10) {
    pCtx->isError = 1;
    sqlite3VdbeMemSetStr
              (&pCtx->s,"local time unavailable",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff
              );
    *pRc = 1;
    local_60.iJD = 0;
  }
  else {
    local_60.validYMD = '\x01';
    local_60.validHMS = '\x01';
    local_60.validJD = '\0';
    local_60.validTZ = '\0';
    local_60.Y = iVar8;
    local_60.M = iVar7;
    local_60.D = iVar9;
    local_60.h = iVar6;
    local_60.m = iVar5;
    local_60.s = dVar1;
    computeJD(&local_60);
    *pRc = 0;
    local_60.iJD = local_60.iJD - sVar2;
  }
  return local_60.iJD;
}

Assistant:

static sqlite3_int64 localtimeOffset(
  DateTime *p,                    /* Date at which to calculate offset */
  sqlite3_context *pCtx,          /* Write error here if one occurs */
  int *pRc                        /* OUT: Error code. SQLITE_OK or ERROR */
){
  DateTime x, y;
  time_t t;
  struct tm sLocal;

  /* Initialize the contents of sLocal to avoid a compiler warning. */
  memset(&sLocal, 0, sizeof(sLocal));

  x = *p;
  computeYMD_HMS(&x);
  if( x.Y<1971 || x.Y>=2038 ){
    x.Y = 2000;
    x.M = 1;
    x.D = 1;
    x.h = 0;
    x.m = 0;
    x.s = 0.0;
  } else {
    int s = (int)(x.s + 0.5);
    x.s = s;
  }
  x.tz = 0;
  x.validJD = 0;
  computeJD(&x);
  t = (time_t)(x.iJD/1000 - 21086676*(i64)10000);
  if( osLocaltime(&t, &sLocal) ){
    sqlite3_result_error(pCtx, "local time unavailable", -1);
    *pRc = SQLITE_ERROR;
    return 0;
  }
  y.Y = sLocal.tm_year + 1900;
  y.M = sLocal.tm_mon + 1;
  y.D = sLocal.tm_mday;
  y.h = sLocal.tm_hour;
  y.m = sLocal.tm_min;
  y.s = sLocal.tm_sec;
  y.validYMD = 1;
  y.validHMS = 1;
  y.validJD = 0;
  y.validTZ = 0;
  computeJD(&y);
  *pRc = SQLITE_OK;
  return y.iJD - x.iJD;
}